

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadMessage<google::protobuf::Message>
               (CodedInputStream *input,Message *value)

{
  uint8_t *puVar1;
  bool bVar2;
  pair<int,_int> pVar3;
  int byte_limit;
  
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (byte_limit = (int)(char)*puVar1, -1 < (char)*puVar1)) {
    input->buffer_ = puVar1 + 1;
    bVar2 = true;
  }
  else {
    byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
    bVar2 = -1 < byte_limit;
  }
  if (bVar2) {
    pVar3 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
    if (-1 < (long)pVar3) {
      bVar2 = MessageLite::MergePartialFromCodedStream(&value->super_MessageLite,input);
      if (bVar2) {
        bVar2 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar3.first);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadMessage(io::CodedInputStream* input,
                                        MessageType* value) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  std::pair<io::CodedInputStream::Limit, int> p =
      input->IncrementRecursionDepthAndPushLimit(length);
  if (p.second < 0 || !value->MergePartialFromCodedStream(input)) return false;
  // Make sure that parsing stopped when the limit was hit, not at an endgroup
  // tag.
  return input->DecrementRecursionDepthAndPopLimit(p.first);
}